

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::InsertAfterElement
          (MergeReturnPass *this,BasicBlock *element,BasicBlock *new_element,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *list)

{
  _List_iterator<spvtools::opt::BasicBlock_*> this_00;
  bool bVar1;
  const_iterator local_50;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<spvtools::opt::BasicBlock_*> local_38;
  _Self local_30;
  _List_iterator<spvtools::opt::BasicBlock_*> pos;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *list_local;
  BasicBlock *new_element_local;
  BasicBlock *element_local;
  MergeReturnPass *this_local;
  
  pos._M_node = (_List_node_base *)list;
  list_local = (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               new_element;
  new_element_local = element;
  element_local = (BasicBlock *)this;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
       ::begin(list);
  local_40 = (_List_node_base *)
             std::__cxx11::
             list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                       (pos._M_node);
  local_30._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<spvtools::opt::BasicBlock*>,spvtools::opt::BasicBlock*>
                 (local_38,(_List_iterator<spvtools::opt::BasicBlock_*>)local_40,&new_element_local)
  ;
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
       ::end(pos._M_node);
  bVar1 = std::operator!=(&local_30,&local_48);
  if (!bVar1) {
    __assert_fail("pos != list->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x30a,
                  "void spvtools::opt::MergeReturnPass::InsertAfterElement(BasicBlock *, BasicBlock *, std::list<BasicBlock *> *)"
                 );
  }
  std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&local_30);
  this_00 = pos;
  std::_List_const_iterator<spvtools::opt::BasicBlock_*>::_List_const_iterator(&local_50,&local_30);
  std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  insert((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
         this_00._M_node,local_50,(value_type *)&list_local);
  return;
}

Assistant:

void MergeReturnPass::InsertAfterElement(BasicBlock* element,
                                         BasicBlock* new_element,
                                         std::list<BasicBlock*>* list) {
  auto pos = std::find(list->begin(), list->end(), element);
  assert(pos != list->end());
  ++pos;
  list->insert(pos, new_element);
}